

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

int AF_AActor_SetOrigin(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  bool bVar1;
  char *pcVar2;
  AActor *this;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_0042366c;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0042366c;
        }
        goto LAB_004235e8;
      }
    }
    else if (this != (AActor *)0x0) goto LAB_0042365c;
    this = (AActor *)0x0;
LAB_004235e8:
    if (numparam == 1) {
      pcVar2 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\x01') {
        if ((uint)numparam < 3) {
          pcVar2 = "(paramnum) < numparam";
        }
        else {
          if (param[2].field_0.field_3.Type == '\x01') {
            if (numparam == 3) {
              pcVar2 = "(paramnum) < numparam";
            }
            else {
              if (param[3].field_0.field_3.Type == '\x01') {
                if ((uint)numparam < 5) {
                  pcVar2 = "(paramnum) < numparam";
                }
                else {
                  if (param[4].field_0.field_3.Type == '\0') {
                    AActor::SetOrigin(this,param[1].field_0.f,param[2].field_0.f,param[3].field_0.f,
                                      param[4].field_0.i != 0);
                    return 0;
                  }
                  pcVar2 = "param[paramnum].Type == REGT_INT";
                }
                __assert_fail(pcVar2,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                              ,0x228,
                              "int AF_AActor_SetOrigin(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              pcVar2 = "param[paramnum].Type == REGT_FLOAT";
            }
            __assert_fail(pcVar2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                          ,0x227,
                          "int AF_AActor_SetOrigin(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pcVar2 = "param[paramnum].Type == REGT_FLOAT";
        }
        __assert_fail(pcVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                      ,0x226,
                      "int AF_AActor_SetOrigin(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
        ;
      }
      pcVar2 = "param[paramnum].Type == REGT_FLOAT";
    }
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x225,
                  "int AF_AActor_SetOrigin(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_0042365c:
  pcVar2 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0042366c:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                ,0x224,"int AF_AActor_SetOrigin(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SetOrigin)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_BOOL(moving);
	self->SetOrigin(x, y, z, moving);
	return 0;
}